

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CS248::OSDText::~OSDText(OSDText *this)

{
  long in_RDI;
  vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> *this_00;
  
  this_00 = *(vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> **)(in_RDI + 0x20);
  if (this_00 != (vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> *)0x0) {
    operator_delete(this_00);
  }
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x28));
  }
  if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x10));
  }
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::clear
            ((vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> *)0x2039e4);
  (*__glewDeleteProgram)(*(GLuint *)(in_RDI + 0x50));
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::~vector(this_00);
  return;
}

Assistant:

OSDText::~OSDText() {

  delete ft;
  delete face;
  delete [] font;

  lines.clear();

  glDeleteProgram(program);
}